

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall
Centaurus::NFABaseState<wchar_t,_Centaurus::IndexVector>::add_transition
          (NFABaseState<wchar_t,_Centaurus::IndexVector> *this,CharClass<wchar_t> *cc,int dest,
          bool long_flag)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  CharClass<wchar_t> *this_01;
  NFATransition<wchar_t> *tr;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__range3;
  bool long_flag_local;
  CharClass<wchar_t> *pCStack_18;
  int dest_local;
  CharClass<wchar_t> *cc_local;
  NFABaseState<wchar_t,_Centaurus::IndexVector> *this_local;
  
  __range3._3_1_ = long_flag;
  __range3._4_4_ = dest;
  pCStack_18 = cc;
  cc_local = (CharClass<wchar_t> *)this;
  bVar1 = CharClass<wchar_t>::is_epsilon(cc);
  if (!bVar1) {
    __end0 = std::
             vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ::begin(&this->m_transitions);
    tr = (NFATransition<wchar_t> *)
         std::
         vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
         ::end(&this->m_transitions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                                       *)&tr), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                ::operator*(&__end0);
      iVar2 = NFATransition<wchar_t>::dest(this_00);
      if (iVar2 == __range3._4_4_) {
        this_01 = NFATransition<wchar_t>::label(this_00);
        bVar1 = CharClass<wchar_t>::is_epsilon(this_01);
        if (!bVar1) {
          NFATransition<wchar_t>::add_class(this_00,pCStack_18);
          if ((__range3._3_1_ & 1) == 0) {
            return;
          }
          NFATransition<wchar_t>::set_long(this_00,true);
          return;
        }
      }
      __gnu_cxx::
      __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
      ::operator++(&__end0);
    }
  }
  std::vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>::
  emplace_back<Centaurus::CharClass<wchar_t>const&,int&,bool&>
            ((vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>
              *)&this->m_transitions,pCStack_18,(int *)((long)&__range3 + 4),
             (bool *)((long)&__range3 + 3));
  return;
}

Assistant:

void add_transition(const CharClass<TCHAR>& cc, int dest, bool long_flag = false)
    {
        if (!cc.is_epsilon())
        {
            for (auto& tr : m_transitions)
            {
                if (tr.dest() == dest && !tr.label().is_epsilon())
                {
                    tr.add_class(cc);
                    if (long_flag) tr.set_long();
                    return;
                }
            }
        }
        m_transitions.emplace_back(cc, dest, long_flag);
    }